

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O3

void fio_connect2cluster(void *ignore)

{
  fio_connect_args args;
  undefined1 auVar1 [24];
  undefined8 in_stack_ffffffffffffffc0;
  undefined7 uStack_7;
  
  if (cluster_data.uuid != 0) {
    fio_force_close(cluster_data.uuid);
  }
  cluster_data.uuid = 0;
  auVar1 = ZEXT1524(CONCAT87(in_stack_ffffffffffffffc0,uStack_7)) << 0x48;
  args.on_fail = (_func_void_intptr_t_void_ptr *)0x15c349;
  args.address = (char *)auVar1._0_8_;
  args.port = (char *)auVar1._8_8_;
  args.on_connect = (_func_void_intptr_t_void_ptr *)auVar1._16_8_;
  args.tls = (void *)0x0;
  args.udata = fio_cluster_on_connect;
  args._48_8_ = fio_cluster_on_fail;
  fio_connect(args);
  return;
}

Assistant:

static void fio_connect2cluster(void *ignore) {
  if (cluster_data.uuid)
    fio_force_close(cluster_data.uuid);
  cluster_data.uuid = 0;
  /* this is called for each child, but not for single a process worker. */
  fio_connect(.address = cluster_data.name, .port = NULL,
              .on_connect = fio_cluster_on_connect,
              .on_fail = fio_cluster_on_fail);
  (void)ignore;
}